

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.h
# Opt level: O3

void __thiscall UnifiedRegex::CharBitvec::ClearRange(CharBitvec *this,uint l,uint h)

{
  byte bVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  undefined4 *puVar5;
  sbyte sVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  
  if (0xff < l) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                       ,0x7e,"(l < Size)","l < Size");
    if (!bVar3) goto LAB_00e5e678;
    *puVar5 = 0;
  }
  if (0xff < h) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                       ,0x7f,"(h < Size)","h < Size");
    if (!bVar3) {
LAB_00e5e678:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  if ((h | l) < 0x100) {
    if (l == h) {
      bVar1 = (byte)l & 0x1f;
      this->vec[l >> 5] = this->vec[l >> 5] & (-2 << bVar1 | 0xfffffffeU >> 0x20 - bVar1);
    }
    else if (l < h) {
      uVar7 = l >> 5;
      uVar8 = h >> 5;
      uVar4 = l & 0x1f;
      uVar9 = h & 0x1f;
      sVar6 = (sbyte)uVar4;
      if (uVar7 == uVar8) {
        iVar10 = (uVar9 - uVar4) + 1;
        uVar4 = 0;
        if (iVar10 != 0x20) {
          uVar4 = ~(~(-1 << ((byte)iVar10 & 0x1f)) << sVar6) & this->vec[uVar7];
        }
        this->vec[uVar7] = uVar4;
      }
      else {
        if (uVar4 == 0) {
          uVar4 = 0;
        }
        else {
          uVar4 = ~(~(-1 << (-sVar6 & 0x1fU)) << sVar6) & this->vec[uVar7];
        }
        this->vec[uVar7] = uVar4;
        if (uVar7 + 1 < uVar8) {
          memset((void *)((long)this->vec + (ulong)(l >> 3 & 0x1c) + 4),0,
                 (ulong)((uVar8 - uVar7) - 2) * 4 + 4);
        }
        uVar4 = 0;
        if (uVar9 != 0x1f) {
          uVar4 = -2 << (sbyte)uVar9 & this->vec[uVar8];
        }
        this->vec[uVar8] = uVar4;
      }
    }
  }
  return;
}

Assistant:

inline void ClearRange(uint l, uint h)
        {
            Assert(l < Size);
            Assert(h < Size);
            __assume(l < Size);
            __assume(h < Size);
            if (l < Size && h < Size)
            {
                if (l == h)
                {
                    vec[l / wordSize] &= ~(1U << (l % wordSize));
                }
                else if (l < h)
                {
                    int lw = l / wordSize;
                    int hw = h / wordSize;
                    int lo = l % wordSize;
                    int hio = h % wordSize;
                    if (lw == hw)
                    {
                        clearrng(vec[lw], lo, hio);
                    }
                    else
                    {
                        clearrng(vec[lw], lo, wordSize - 1);
                        for (int w = lw + 1; w < hw; w++)
                        {
                            vec[w] = 0;
                        }
                        clearrng(vec[hw], 0, hio);
                    }
                }
            }
        }